

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O1

sc_uint_base * __thiscall sc_dt::sc_uint_base::operator=(sc_uint_base *this,sc_bv_base *a)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  sc_digit *psVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint_type uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar17;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar22 [16];
  
  uVar3 = this->m_len;
  uVar5 = a->m_len;
  if ((int)uVar3 < a->m_len) {
    uVar5 = uVar3;
  }
  if ((int)uVar5 < 1) {
    uVar6 = 0;
  }
  else {
    psVar4 = a->m_data;
    uVar9 = this->m_val;
    uVar6 = 0;
    do {
      uVar10 = 1L << ((byte)uVar6 & 0x3f);
      if ((psVar4[uVar6 >> 5 & 0x7ffffff] >> ((uint)uVar6 & 0x1f) & 1) == 0) {
        uVar9 = uVar9 & ~uVar10;
      }
      else {
        uVar9 = uVar9 | uVar10;
      }
      this->m_val = uVar9;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  if ((int)uVar6 < (int)uVar3) {
    lVar7 = (ulong)uVar3 - (uVar6 & 0xffffffff);
    lVar8 = lVar7 + -1;
    uVar10 = uVar6 & 0xffffffff;
    lVar17 = (uVar6 & 0xffffffff) + 1;
    auVar16._8_8_ = 0xffffffffffffffff;
    auVar16._0_8_ = this->m_val;
    auVar12._8_4_ = (int)lVar8;
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 2;
    do {
      auVar11 = auVar16;
      auVar16._0_8_ = ~(1L << uVar10) & auVar11._0_8_;
      auVar16._8_8_ = ~(1L << lVar17) & auVar11._8_8_;
      uVar10 = uVar10 + 2;
      lVar17 = lVar17 + 2;
      lVar1 = (lVar7 + 1U & 0xfffffffffffffffe) + lVar8;
      lVar8 = lVar8 + -2;
    } while (lVar1 != 4);
    lVar8 = -lVar8;
    auVar13._8_4_ = (int)lVar8;
    auVar13._0_8_ = lVar8;
    auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar12 = auVar12 ^ _DAT_0021e870;
    auVar14 = (auVar13 | _DAT_0021e860) ^ _DAT_0021e870;
    iVar18 = -(uint)(auVar12._0_4_ < auVar14._0_4_);
    iVar19 = -(uint)(auVar12._4_4_ < auVar14._4_4_);
    iVar20 = -(uint)(auVar12._8_4_ < auVar14._8_4_);
    iVar21 = -(uint)(auVar12._12_4_ < auVar14._12_4_);
    auVar22._4_4_ = iVar18;
    auVar22._0_4_ = iVar18;
    auVar22._8_4_ = iVar20;
    auVar22._12_4_ = iVar20;
    iVar18 = -(uint)(auVar14._4_4_ == auVar12._4_4_);
    iVar20 = -(uint)(auVar14._12_4_ == auVar12._12_4_);
    auVar14._4_4_ = iVar18;
    auVar14._0_4_ = iVar18;
    auVar14._8_4_ = iVar20;
    auVar14._12_4_ = iVar20;
    auVar15._4_4_ = iVar19;
    auVar15._0_4_ = iVar19;
    auVar15._8_4_ = iVar21;
    auVar15._12_4_ = iVar21;
    auVar15 = auVar15 | auVar14 & auVar22;
    auVar16 = ~auVar15 & auVar16 | auVar11 & auVar15;
    this->m_val = auVar16._8_8_ & auVar16._0_8_;
  }
  bVar2 = (byte)this->m_ulen;
  this->m_val = (this->m_val << (bVar2 & 0x3f)) >> (bVar2 & 0x3f);
  return this;
}

Assistant:

sc_uint_base&
sc_uint_base::operator = ( const sc_bv_base& a )
{
    int minlen = sc_min( m_len, a.length() );
    int i = 0;
    for( ; i < minlen; ++ i ) {
	set( i, a.get_bit( i ) );
    }
    for( ; i < m_len; ++ i ) {
	// zero extension
	set( i, 0 );
    }
    extend_sign();
    return *this;
}